

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

bool FIX::thread_spawn(THREAD_START_ROUTINE *func,void *var,thread_id *thread)

{
  int iVar1;
  pthread_t local_30;
  thread_id result;
  thread_id *thread_local;
  void *var_local;
  THREAD_START_ROUTINE *func_local;
  
  local_30 = 0;
  result = (thread_id)thread;
  thread_local = (thread_id *)var;
  var_local = func;
  iVar1 = pthread_create(&local_30,(pthread_attr_t *)0x0,(__start_routine *)func,var);
  if (iVar1 == 0) {
    *(pthread_t *)result = local_30;
  }
  return iVar1 == 0;
}

Assistant:

bool thread_spawn( THREAD_START_ROUTINE func, void* var, thread_id& thread )
{
#ifdef _MSC_VER
  thread_id result = 0;
  unsigned int id = 0;
  result = _beginthreadex( NULL, 0, func, var, 0, &id );
  if ( result == 0 ) return false;
#else
  thread_id result = 0;
  if( pthread_create( &result, 0, func, var ) != 0 ) return false;
#endif
  thread = result;
  return true;
}